

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1509.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  int res;
  CURL *curl;
  undefined8 uStack_20;
  CURLcode code;
  long headerSize;
  char *URL_local;
  
  ec_1 = CURLE_OK;
  headerSize = (long)URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar4 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                  ,0x28,CVar2,uVar4);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLE_OK) {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                    ,0x2a);
      ec_1 = CURLE_USE_SSL_FAILED|CURLE_SSL_CACERT;
    }
    if (ec_1 == CURLE_OK) {
      CVar2 = curl_easy_setopt(lVar5,0x2714,libtest_arg2);
      uVar1 = _stderr;
      if (CVar2 != CURLE_OK) {
        uVar4 = curl_easy_strerror(CVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                      ,0x2c,CVar2,uVar4);
        ec_1 = CVar2;
      }
      if (ec_1 == CURLE_OK) {
        CVar2 = curl_easy_setopt(lVar5,0x4e2b,WriteOutput);
        uVar1 = _stderr;
        if (CVar2 != CURLE_OK) {
          uVar4 = curl_easy_strerror(CVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                        ,0x2e,CVar2,uVar4);
          ec_1 = CVar2;
        }
        if (ec_1 == CURLE_OK) {
          CVar2 = curl_easy_setopt(lVar5,0x4e6f,WriteHeader);
          uVar1 = _stderr;
          if (CVar2 != CURLE_OK) {
            uVar4 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                          ,0x2f,CVar2,uVar4);
            ec_1 = CVar2;
          }
          if (ec_1 == CURLE_OK) {
            CVar2 = curl_easy_setopt(lVar5,0x2a,1);
            uVar1 = _stderr;
            if (CVar2 != CURLE_OK) {
              uVar4 = curl_easy_strerror(CVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                            ,0x31,CVar2,uVar4);
              ec_1 = CVar2;
            }
            if (ec_1 == CURLE_OK) {
              CVar2 = curl_easy_setopt(lVar5,0x29,1);
              uVar1 = _stderr;
              if (CVar2 != CURLE_OK) {
                uVar4 = curl_easy_strerror(CVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                              ,0x32,CVar2,uVar4);
                ec_1 = CVar2;
              }
              if (ec_1 == CURLE_OK) {
                CVar2 = curl_easy_setopt(lVar5,0x2712,headerSize);
                uVar1 = _stderr;
                if (CVar2 != CURLE_OK) {
                  uVar4 = curl_easy_strerror(CVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                                ,0x33,CVar2,uVar4);
                  ec_1 = CVar2;
                }
                if (ec_1 == CURLE_OK) {
                  CVar2 = curl_easy_setopt(lVar5,0x3d,1);
                  uVar1 = _stderr;
                  if (CVar2 != CURLE_OK) {
                    uVar4 = curl_easy_strerror(CVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                                  ,0x34,CVar2,uVar4);
                    ec_1 = CVar2;
                  }
                  if (ec_1 == CURLE_OK) {
                    iVar3 = curl_easy_perform(lVar5);
                    uVar1 = _stderr;
                    if (iVar3 == 0) {
                      iVar3 = curl_easy_getinfo(lVar5,0x20000b,&stack0xffffffffffffffe0);
                      uVar1 = _stderr;
                      if (iVar3 == 0) {
                        curl_mprintf("header length is ........: %lu\n",uStack_20);
                        curl_mprintf("header length should be..: %lu\n",realHeaderSize);
                      }
                      else {
                        uVar4 = curl_easy_strerror(iVar3);
                        curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                                      ,0x43,iVar3,uVar4);
                        ec_1 = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
                      }
                    }
                    else {
                      uVar4 = curl_easy_strerror(iVar3);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1509.c"
                                    ,0x3a,iVar3,uVar4);
                      ec_1 = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  long headerSize;
  CURLcode code;
  CURL *curl = NULL;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_PROXY, libtest_arg2); /* set in first.c */

  easy_setopt(curl, CURLOPT_WRITEFUNCTION, *WriteOutput);
  easy_setopt(curl, CURLOPT_HEADERFUNCTION, *WriteHeader);

  easy_setopt(curl, CURLOPT_HEADER, 1L);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_HTTPPROXYTUNNEL, 1L);

  code = curl_easy_perform(curl);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  code = curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &headerSize);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  printf("header length is ........: %lu\n", headerSize);
  printf("header length should be..: %lu\n", realHeaderSize);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}